

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_lt_quiet_sparc(float64 a,float64 b,float_status *status)

{
  bool bVar1;
  byte bVar2;
  uint64_t a_1;
  float64 fVar3;
  float64 fVar4;
  bool bVar5;
  
  fVar3 = float64_squash_input_denormal_sparc(a,status);
  fVar4 = float64_squash_input_denormal_sparc(b,status);
  if (((~fVar3 & 0x7ff0000000000000) == 0 && (fVar3 & 0xfffffffffffff) != 0) ||
     ((fVar4 & 0xfffffffffffff) != 0 && (~fVar4 & 0x7ff0000000000000) == 0)) {
    if (((fVar3 & 0x7ff8000000000000) == 0x7ff0000000000000 && (fVar3 & 0x7ffffffffffff) != 0) ||
       ((fVar4 & 0x7ffffffffffff) != 0 && (fVar4 & 0x7ff8000000000000) == 0x7ff0000000000000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    bVar2 = 0;
  }
  else {
    if ((long)(fVar4 ^ fVar3) < 0) {
      bVar5 = (long)fVar3 < 0;
      bVar1 = ((fVar4 | fVar3) & 0x7fffffffffffffff) != 0;
    }
    else {
      bVar5 = fVar3 != fVar4;
      bVar1 = (long)fVar3 < 0 != fVar3 < fVar4;
    }
    bVar2 = bVar1 & bVar5;
  }
  return (int)bVar2;
}

Assistant:

int float64_lt_quiet(float64 a, float64 b, float_status *status)
{
    flag aSign, bSign;
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat64Sign( a );
    bSign = extractFloat64Sign( b );
    av = float64_val(a);
    bv = float64_val(b);
    if ( aSign != bSign ) return aSign && ( (uint64_t) ( ( av | bv )<<1 ) != 0 );
    return ( av != bv ) && ( aSign ^ ( av < bv ) );

}